

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void ngai_get_first_last_indices(Integer g_a)

{
  short sVar1;
  short sVar2;
  int iVar3;
  logical lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long in_RDI;
  char err_string_1 [256];
  Integer _d_7;
  int _ndim_9;
  int _i_9;
  int _itmp_3;
  int _offset_3;
  int _ndim_8;
  int _i_8;
  int _index_7 [7];
  int _ndim_7;
  int _i_7;
  int _itmp_2;
  int _ndim_6;
  int _i_6;
  int _index_6 [7];
  int _ndim_5;
  int _i_5;
  Integer _dimpos_3;
  Integer _dimstart_3;
  Integer _dim_3;
  Integer _index_5;
  Integer _d_6;
  Integer _nb_3;
  Integer _loc_3;
  Integer _dimpos_2;
  Integer _dimstart_2;
  Integer _dim_2;
  Integer _index_4;
  Integer _d_5;
  Integer _nb_2;
  Integer _loc_2;
  Integer _iproc_1;
  Integer _p_handle_1;
  Integer _hi_1 [7];
  Integer _lo_1 [7];
  Integer _last_1;
  Integer _factor_1;
  Integer _w_1;
  Integer _d_4;
  Integer _offset_2;
  char err_string [256];
  Integer _d_3;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_2;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_1;
  Integer _nb;
  Integer _loc;
  Integer _iproc;
  Integer _p_handle;
  Integer _hi [7];
  Integer _lo [7];
  Integer _last;
  Integer _factor;
  Integer _w;
  Integer _d;
  Integer _offset;
  char *lptr;
  char *fptr;
  int Save_default_group;
  Integer id;
  Integer size;
  Integer type;
  Integer handle;
  Integer subscript [7];
  Integer index [7];
  Integer map_offset [7];
  Integer ndim;
  Integer itmp;
  Integer j;
  Integer i;
  Integer np;
  Integer icnt;
  Integer nlast;
  Integer nfirst;
  Integer ilast;
  Integer ifirst;
  Integer nproc;
  Integer inode;
  Integer nnodes;
  Integer nelems;
  Integer hi [7];
  Integer lo [7];
  char local_738 [256];
  ulong local_638;
  int local_630;
  int local_62c;
  int local_628;
  int local_624;
  int local_620;
  int local_61c;
  int local_618 [7];
  int local_5fc;
  int local_5f8;
  int local_5f4;
  int local_5f0;
  int local_5ec;
  int local_5e8 [10];
  int local_5c0;
  int local_5bc;
  char *in_stack_fffffffffffffa48;
  char *in_stack_fffffffffffffa50;
  long local_5a0;
  long local_598;
  long local_590;
  long local_578;
  long local_568;
  long local_560;
  long local_558;
  long local_548;
  Integer *in_stack_fffffffffffffac0;
  Integer in_stack_fffffffffffffac8;
  Integer in_stack_fffffffffffffad0;
  C_Integer aCStack_4f8 [7];
  long local_4c0;
  long local_4b8;
  long local_4b0;
  long local_4a8;
  long local_4a0;
  char local_498 [80];
  Integer *in_stack_fffffffffffffbb8;
  Integer *in_stack_fffffffffffffbc0;
  Integer in_stack_fffffffffffffbc8;
  Integer in_stack_fffffffffffffbd0;
  Integer *in_stack_fffffffffffffbd8;
  Integer *in_stack_fffffffffffffbe0;
  Integer in_stack_fffffffffffffbe8;
  ulong local_398;
  int local_38c;
  int local_388;
  int local_384;
  int local_37c;
  int local_378 [7];
  int local_35c;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  int local_348 [10];
  int local_320;
  int local_31c;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  C_Integer aCStack_298 [8];
  C_Integer aCStack_258 [8];
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  char *local_1e8;
  int local_1dc;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long alStack_1b8 [8];
  long local_178 [8];
  long alStack_138 [8];
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  Integer local_a8;
  long local_a0;
  Integer local_98;
  long local_90;
  long local_88 [8];
  long local_48 [9];
  
  local_1c0 = in_RDI + 1000;
  local_1d0 = 0;
  local_f8 = (long)GA[local_1c0].ndim;
  local_90 = 1;
  for (local_e0 = 0; local_e0 < local_f8; local_e0 = local_e0 + 1) {
    local_90 = GA[local_1c0].dims[local_e0] * local_90;
  }
  lVar4 = pnga_is_mirrored(in_RDI);
  if (lVar4 == 0) {
    for (local_e0 = 0; local_e0 < local_f8; local_e0 = local_e0 + 1) {
      GA[local_1c0].first[local_e0] = 0;
      GA[local_1c0].last[local_e0] = -1;
      GA[local_1c0].shm_length = -1;
    }
  }
  else {
    local_1dc = GA_Default_Proc_Group;
    GA_Default_Proc_Group = -1;
    local_98 = pnga_cluster_nnodes();
    local_a0 = pnga_cluster_nodeid();
    local_a8 = pnga_cluster_nprocs(0x1d793c);
    local_b0 = (long)((double)(local_a0 * local_90) / (double)local_98);
    if (local_a0 == local_98 + -1) {
      local_b8 = local_90 + -1;
    }
    else {
      local_b8 = (long)((double)((local_a0 + 1) * local_90) / (double)local_98) + -1;
    }
    for (local_e0 = 0; local_e0 < local_f8; local_e0 = local_e0 + 1) {
      alStack_138[local_e0] = 0;
      for (local_e8 = 0; local_e8 < local_e0; local_e8 = local_e8 + 1) {
        alStack_138[local_e0] = (long)GA[local_1c0].nblock[local_e8] + alStack_138[local_e0];
      }
    }
    local_d0 = 0;
    local_c0 = -1;
    local_c8 = -1;
    for (local_e0 = 0; local_e0 < local_a8; local_e0 = local_e0 + 1) {
      pnga_proc_topology(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                         in_stack_fffffffffffffac0);
      local_90 = 1;
      for (local_e8 = 0; local_e8 < local_f8; local_e8 = local_e8 + 1) {
        if (local_178[local_e8] < (long)(GA[local_1c0].nblock[local_e8] + -1)) {
          local_f0 = GA[local_1c0].mapc[alStack_138[local_e8] + local_178[local_e8] + 1] -
                     GA[local_1c0].mapc[alStack_138[local_e8] + local_178[local_e8]];
          local_90 = local_f0 * local_90;
        }
        else {
          local_f0 = (GA[local_1c0].dims[local_e8] -
                     GA[local_1c0].mapc[alStack_138[local_e8] + local_178[local_e8]]) + 1;
          local_90 = local_f0 * local_90;
        }
      }
      local_d0 = local_90 + local_d0;
      if ((local_b0 <= local_d0 + -1) && (local_c0 < 0)) {
        local_c0 = local_e0;
      }
      if (((local_b8 <= local_d0 + -1) && (-1 < local_c0)) && (local_c8 < 0)) {
        local_c8 = local_e0;
      }
    }
    local_d0 = 0;
    for (local_e0 = 0; local_e0 < local_c0; local_e0 = local_e0 + 1) {
      pnga_distribution(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                        in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      local_90 = 1;
      for (local_e8 = 0; local_e8 < local_f8; local_e8 = local_e8 + 1) {
        if (local_88[local_e8] < local_48[local_e8]) {
          local_90 = 0;
        }
        else {
          local_90 = ((local_88[local_e8] - local_48[local_e8]) + 1) * local_90;
        }
      }
      local_d0 = local_90 + local_d0;
    }
    local_b0 = local_b0 - local_d0;
    local_d8 = local_c0;
    pnga_distribution(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                      in_stack_fffffffffffffbb8);
    local_90 = 1;
    for (local_e0 = 0; local_e0 < local_f8 + -1; local_e0 = local_e0 + 1) {
      local_90 = ((local_88[local_e0] - local_48[local_e0]) + 1) * local_90;
    }
    if (local_b0 % local_90 == 0) {
      local_b0 = local_b0 / local_90;
    }
    else {
      local_b0 = (local_b0 - local_b0 % local_90) / local_90 + 1;
    }
    if (GA[local_1c0].dims[local_f8 + -1] + -1 < local_b0) {
      local_b0 = GA[local_1c0].dims[local_f8 + -1] + -1;
    }
    pnga_proc_topology(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0
                      );
    alStack_1b8[local_f8 + -1] = local_b0;
    for (local_e0 = 0; local_e0 < local_f8 + -1; local_e0 = local_e0 + 1) {
      alStack_1b8[local_e0] = 0;
    }
    for (local_e0 = 0; local_e0 < local_f8; local_e0 = local_e0 + 1) {
      GA[local_1c0].first[local_e0] =
           GA[local_1c0].mapc[alStack_138[local_e0] + local_178[local_e0]] + alStack_1b8[local_e0];
    }
    if (local_c0 < local_c8) {
      local_d0 = 0;
      for (local_e0 = 0; local_e0 < local_c8; local_e0 = local_e0 + 1) {
        pnga_distribution(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                          in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        local_90 = 1;
        for (local_e8 = 0; local_e8 < local_f8; local_e8 = local_e8 + 1) {
          if (local_88[local_e8] < local_48[local_e8]) {
            local_90 = 0;
          }
          else {
            local_90 = ((local_88[local_e8] - local_48[local_e8]) + 1) * local_90;
          }
        }
        local_d0 = local_90 + local_d0;
      }
    }
    local_b8 = local_b8 - local_d0;
    local_d8 = local_c8;
    pnga_distribution(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                      in_stack_fffffffffffffbb8);
    local_90 = 1;
    for (local_e0 = 0; local_e0 < local_f8 + -1; local_e0 = local_e0 + 1) {
      local_90 = ((local_88[local_e0] - local_48[local_e0]) + 1) * local_90;
    }
    local_b8 = (local_b8 - local_b8 % local_90) / local_90;
    alStack_1b8[local_f8 + -1] = local_b8;
    for (local_e0 = 0; local_e0 < local_f8 + -1; local_e0 = local_e0 + 1) {
      alStack_1b8[local_e0] = local_88[local_e0] - local_48[local_e0];
    }
    pnga_proc_topology(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0
                      );
    for (local_e0 = 0; local_e0 < local_f8; local_e0 = local_e0 + 1) {
      GA[local_1c0].last[local_e0] =
           GA[local_1c0].mapc[alStack_138[local_e0] + local_178[local_e0]] + alStack_1b8[local_e0];
      if (GA[local_1c0].dims[local_e0] < GA[local_1c0].last[local_e0]) {
        GA[local_1c0].last[local_e0] = GA[local_1c0].dims[local_e0];
      }
    }
    local_1c8 = (long)GA[local_1c0].type;
    switch(local_1c8) {
    case 0x3e9:
      local_1d0 = 4;
      break;
    case 0x3ea:
      local_1d0 = 8;
      break;
    case 0x3eb:
      local_1d0 = 4;
      break;
    case 0x3ec:
      local_1d0 = 8;
      break;
    default:
      pnga_error(in_stack_fffffffffffffa50,(Integer)in_stack_fffffffffffffa48);
      break;
    case 0x3ee:
      local_1d0 = 8;
      break;
    case 0x3ef:
      local_1d0 = 0x10;
      break;
    case 0x3f8:
      local_1d0 = 8;
    }
    for (local_e0 = 0; local_e0 < local_f8; local_e0 = local_e0 + 1) {
      local_178[local_e0] = GA[local_1c0].first[local_e0];
    }
    lVar4 = pnga_locate(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                        in_stack_fffffffffffffbd8);
    local_e0 = (long)(int)lVar4;
    local_1f8 = 0;
    local_210 = 1;
    local_218 = (long)(GA[local_1c0].ndim + -1);
    if (GA[local_1c0].distr_type == 0) {
      if (GA[local_1c0].num_rstrctd == 0) {
        local_2d0 = (long)GA[local_1c0].ndim;
        local_2d8 = 0;
        local_2b8 = 1;
        for (local_2c0 = 0; local_2c0 < local_2d0; local_2c0 = local_2c0 + 1) {
          local_2b8 = GA[local_1c0].nblock[local_2c0] * local_2b8;
        }
        if ((local_2b8 + -1 < local_1d8) || (local_1d8 < 0)) {
          for (local_2c0 = 0; local_2c0 < local_2d0; local_2c0 = local_2c0 + 1) {
            aCStack_258[local_2c0] = 0;
            aCStack_298[local_2c0] = -1;
          }
        }
        else {
          local_2c8 = local_1d8;
          for (local_2c0 = 0; local_2c0 < local_2d0; local_2c0 = local_2c0 + 1) {
            local_2b0 = local_2c8 % (long)GA[local_1c0].nblock[local_2c0];
            local_2c8 = local_2c8 / (long)GA[local_1c0].nblock[local_2c0];
            local_2e0 = local_2b0 + local_2d8;
            local_2d8 = GA[local_1c0].nblock[local_2c0] + local_2d8;
            aCStack_258[local_2c0] = GA[local_1c0].mapc[local_2e0];
            if (local_2b0 == GA[local_1c0].nblock[local_2c0] + -1) {
              aCStack_298[local_2c0] = GA[local_1c0].dims[local_2c0];
            }
            else {
              aCStack_298[local_2c0] = GA[local_1c0].mapc[local_2e0 + 1] + -1;
            }
          }
        }
      }
      else if (local_1d8 < GA[local_1c0].num_rstrctd) {
        local_308 = (long)GA[local_1c0].ndim;
        local_310 = 0;
        local_2f0 = 1;
        for (local_2f8 = 0; local_2f8 < local_308; local_2f8 = local_2f8 + 1) {
          local_2f0 = GA[local_1c0].nblock[local_2f8] * local_2f0;
        }
        if ((local_2f0 + -1 < local_1d8) || (local_1d8 < 0)) {
          for (local_2f8 = 0; local_2f8 < local_308; local_2f8 = local_2f8 + 1) {
            aCStack_258[local_2f8] = 0;
            aCStack_298[local_2f8] = -1;
          }
        }
        else {
          local_300 = local_1d8;
          for (local_2f8 = 0; local_2f8 < local_308; local_2f8 = local_2f8 + 1) {
            local_2e8 = local_300 % (long)GA[local_1c0].nblock[local_2f8];
            local_300 = local_300 / (long)GA[local_1c0].nblock[local_2f8];
            local_318 = local_2e8 + local_310;
            local_310 = GA[local_1c0].nblock[local_2f8] + local_310;
            aCStack_258[local_2f8] = GA[local_1c0].mapc[local_318];
            if (local_2e8 == GA[local_1c0].nblock[local_2f8] + -1) {
              aCStack_298[local_2f8] = GA[local_1c0].dims[local_2f8];
            }
            else {
              aCStack_298[local_2f8] = GA[local_1c0].mapc[local_318 + 1] + -1;
            }
          }
        }
      }
      else {
        sVar1 = GA[local_1c0].ndim;
        local_320 = (int)sVar1;
        for (local_31c = 0; local_31c < sVar1; local_31c = local_31c + 1) {
          aCStack_258[local_31c] = 0;
          aCStack_298[local_31c] = -1;
        }
      }
    }
    else {
      local_388 = (int)local_1d8;
      if (((GA[local_1c0].distr_type == 1) || (GA[local_1c0].distr_type == 2)) ||
         (GA[local_1c0].distr_type == 3)) {
        sVar1 = GA[local_1c0].ndim;
        local_350 = (int)sVar1;
        sVar2 = GA[local_1c0].ndim;
        local_35c = (int)sVar2;
        local_354 = local_388;
        local_348[0] = (int)((long)local_388 % GA[local_1c0].num_blocks[0]);
        for (local_358 = 1; local_358 < sVar2; local_358 = local_358 + 1) {
          local_354 = (int)((long)(local_354 - local_348[local_358 + -1]) /
                           GA[local_1c0].num_blocks[local_358 + -1]);
          local_348[local_358] = (int)((long)local_354 % GA[local_1c0].num_blocks[local_358]);
        }
        for (local_34c = 0; local_34c < sVar1; local_34c = local_34c + 1) {
          aCStack_258[local_34c] =
               (long)local_348[local_34c] * GA[local_1c0].block_dims[local_34c] + 1;
          aCStack_298[local_34c] =
               (long)(local_348[local_34c] + 1) * GA[local_1c0].block_dims[local_34c];
          if (GA[local_1c0].dims[local_34c] < aCStack_298[local_34c]) {
            aCStack_298[local_34c] = GA[local_1c0].dims[local_34c];
          }
        }
      }
      else if (GA[local_1c0].distr_type == 4) {
        sVar1 = GA[local_1c0].ndim;
        local_384 = 0;
        sVar2 = GA[local_1c0].ndim;
        local_378[0] = (int)((long)local_388 % GA[local_1c0].num_blocks[0]);
        for (local_38c = 1; local_38c < sVar2; local_38c = local_38c + 1) {
          local_388 = (int)((long)(local_388 - local_378[local_38c + -1]) /
                           GA[local_1c0].num_blocks[local_38c + -1]);
          local_378[local_38c] = (int)((long)local_388 % GA[local_1c0].num_blocks[local_38c]);
        }
        for (local_37c = 0; local_37c < sVar1; local_37c = local_37c + 1) {
          aCStack_258[local_37c] = GA[local_1c0].mapc[local_384 + local_378[local_37c]];
          if ((long)local_378[local_37c] < GA[local_1c0].num_blocks[local_37c] + -1) {
            aCStack_298[local_37c] = GA[local_1c0].mapc[local_384 + local_378[local_37c] + 1] + -1;
          }
          else {
            aCStack_298[local_37c] = GA[local_1c0].dims[local_37c];
          }
          local_384 = local_384 + (int)GA[local_1c0].num_blocks[local_37c];
        }
      }
    }
    local_2a0 = (long)GA[local_1c0].p_handle;
    local_2a8 = local_1d8;
    for (local_398 = 0; (long)local_398 < (long)GA[local_1c0].ndim; local_398 = local_398 + 1) {
      if ((GA[local_1c0].first[local_398] < aCStack_258[local_398]) ||
         (aCStack_298[local_398] < GA[local_1c0].first[local_398])) {
        sprintf(local_498,"check subscript failed:%ld not in (%ld:%ld) dim=%d",
                GA[local_1c0].first[local_398],aCStack_258[local_398],aCStack_298[local_398],
                local_398 & 0xffffffff);
        pnga_error(in_stack_fffffffffffffa50,(Integer)in_stack_fffffffffffffa48);
      }
    }
    for (local_200 = 0; local_200 < local_218; local_200 = local_200 + 1) {
      local_208 = GA[local_1c0].width[local_200];
      local_1f8 = ((GA[local_1c0].first[local_200] - aCStack_258[local_200]) + local_208) *
                  local_210 + local_1f8;
      local_210 = ((aCStack_298[local_200] - aCStack_258[local_200]) + 1 + local_208 * 2) *
                  local_210;
    }
    local_1f8 = ((GA[local_1c0].first[local_218] - aCStack_258[local_218]) +
                GA[local_1c0].width[local_218]) * local_210 + local_1f8;
    if (local_2a0 == 0) {
      local_2a8 = (long)PGRP_LIST->inv_map_proc_list[local_2a8];
    }
    if (0 < GA[local_1c0].num_rstrctd) {
      local_2a8 = GA[local_1c0].rstrctd_list[local_2a8];
    }
    local_1e8 = GA[local_1c0].ptr[local_2a8] + local_1f8 * GA[local_1c0].elemsize;
    for (local_e0 = 0; local_e0 < local_f8; local_e0 = local_e0 + 1) {
      local_178[local_e0] = GA[local_1c0].last[local_e0];
    }
    lVar4 = pnga_locate(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                        in_stack_fffffffffffffbd8);
    local_e0 = (long)(int)lVar4;
    local_4a0 = 0;
    local_4b8 = 1;
    local_4c0 = (long)(GA[local_1c0].ndim + -1);
    if (GA[local_1c0].distr_type == 0) {
      if (GA[local_1c0].num_rstrctd == 0) {
        lVar5 = (long)GA[local_1c0].ndim;
        local_578 = 0;
        local_558 = 1;
        for (local_560 = 0; local_560 < lVar5; local_560 = local_560 + 1) {
          local_558 = GA[local_1c0].nblock[local_560] * local_558;
        }
        if ((local_558 + -1 < local_1d8) || (local_1d8 < 0)) {
          for (local_560 = 0; local_560 < lVar5; local_560 = local_560 + 1) {
            aCStack_4f8[local_560] = 0;
            *(undefined8 *)(&stack0xfffffffffffffac8 + local_560 * 8) = 0xffffffffffffffff;
          }
        }
        else {
          local_568 = local_1d8;
          for (local_560 = 0; local_560 < lVar5; local_560 = local_560 + 1) {
            lVar7 = local_568 % (long)GA[local_1c0].nblock[local_560];
            local_568 = local_568 / (long)GA[local_1c0].nblock[local_560];
            lVar6 = lVar7 + local_578;
            local_578 = GA[local_1c0].nblock[local_560] + local_578;
            aCStack_4f8[local_560] = GA[local_1c0].mapc[lVar6];
            if (lVar7 == GA[local_1c0].nblock[local_560] + -1) {
              *(C_Integer *)(&stack0xfffffffffffffac8 + local_560 * 8) =
                   GA[local_1c0].dims[local_560];
            }
            else {
              *(C_Integer *)(&stack0xfffffffffffffac8 + local_560 * 8) =
                   GA[local_1c0].mapc[lVar6 + 1] + -1;
            }
          }
        }
      }
      else if (local_1d8 < GA[local_1c0].num_rstrctd) {
        lVar5 = (long)GA[local_1c0].ndim;
        in_stack_fffffffffffffa50 = (char *)0x0;
        local_590 = 1;
        for (local_598 = 0; local_598 < lVar5; local_598 = local_598 + 1) {
          local_590 = GA[local_1c0].nblock[local_598] * local_590;
        }
        if ((local_590 + -1 < local_1d8) || (local_1d8 < 0)) {
          for (local_598 = 0; local_598 < lVar5; local_598 = local_598 + 1) {
            aCStack_4f8[local_598] = 0;
            *(undefined8 *)(&stack0xfffffffffffffac8 + local_598 * 8) = 0xffffffffffffffff;
          }
        }
        else {
          local_5a0 = local_1d8;
          for (local_598 = 0; local_598 < lVar5; local_598 = local_598 + 1) {
            lVar6 = local_5a0 % (long)GA[local_1c0].nblock[local_598];
            local_5a0 = local_5a0 / (long)GA[local_1c0].nblock[local_598];
            in_stack_fffffffffffffa48 = in_stack_fffffffffffffa50 + lVar6;
            in_stack_fffffffffffffa50 = in_stack_fffffffffffffa50 + GA[local_1c0].nblock[local_598];
            aCStack_4f8[local_598] = GA[local_1c0].mapc[(long)in_stack_fffffffffffffa48];
            if (lVar6 == GA[local_1c0].nblock[local_598] + -1) {
              *(C_Integer *)(&stack0xfffffffffffffac8 + local_598 * 8) =
                   GA[local_1c0].dims[local_598];
            }
            else {
              *(C_Integer *)(&stack0xfffffffffffffac8 + local_598 * 8) =
                   GA[local_1c0].mapc[(long)(in_stack_fffffffffffffa48 + 1)] + -1;
            }
          }
        }
      }
      else {
        sVar1 = GA[local_1c0].ndim;
        local_5c0 = (int)sVar1;
        for (local_5bc = 0; local_5bc < sVar1; local_5bc = local_5bc + 1) {
          aCStack_4f8[local_5bc] = 0;
          *(undefined8 *)(&stack0xfffffffffffffac8 + (long)local_5bc * 8) = 0xffffffffffffffff;
        }
      }
    }
    else {
      iVar3 = (int)local_1d8;
      if (((GA[local_1c0].distr_type == 1) || (GA[local_1c0].distr_type == 2)) ||
         (GA[local_1c0].distr_type == 3)) {
        sVar1 = GA[local_1c0].ndim;
        local_5f0 = (int)sVar1;
        sVar2 = GA[local_1c0].ndim;
        local_5fc = (int)sVar2;
        local_5f4 = iVar3;
        local_5e8[0] = (int)((long)iVar3 % GA[local_1c0].num_blocks[0]);
        for (local_5f8 = 1; local_5f8 < sVar2; local_5f8 = local_5f8 + 1) {
          local_5f4 = (int)((long)(local_5f4 - local_5e8[local_5f8 + -1]) /
                           GA[local_1c0].num_blocks[local_5f8 + -1]);
          local_5e8[local_5f8] = (int)((long)local_5f4 % GA[local_1c0].num_blocks[local_5f8]);
        }
        for (local_5ec = 0; local_5ec < sVar1; local_5ec = local_5ec + 1) {
          aCStack_4f8[local_5ec] =
               (long)local_5e8[local_5ec] * GA[local_1c0].block_dims[local_5ec] + 1;
          *(long *)(&stack0xfffffffffffffac8 + (long)local_5ec * 8) =
               (long)(local_5e8[local_5ec] + 1) * GA[local_1c0].block_dims[local_5ec];
          if (GA[local_1c0].dims[local_5ec] <
              *(long *)(&stack0xfffffffffffffac8 + (long)local_5ec * 8)) {
            *(C_Integer *)(&stack0xfffffffffffffac8 + (long)local_5ec * 8) =
                 GA[local_1c0].dims[local_5ec];
          }
        }
      }
      else if (GA[local_1c0].distr_type == 4) {
        local_620 = (int)GA[local_1c0].ndim;
        local_624 = 0;
        local_630 = (int)GA[local_1c0].ndim;
        local_618[0] = (int)((long)iVar3 % GA[local_1c0].num_blocks[0]);
        local_628 = iVar3;
        for (local_62c = 1; local_62c < local_630; local_62c = local_62c + 1) {
          local_628 = (int)((long)(local_628 - local_618[local_62c + -1]) /
                           GA[local_1c0].num_blocks[local_62c + -1]);
          local_618[local_62c] = (int)((long)local_628 % GA[local_1c0].num_blocks[local_62c]);
        }
        for (local_61c = 0; local_61c < local_620; local_61c = local_61c + 1) {
          aCStack_4f8[local_61c] = GA[local_1c0].mapc[local_624 + local_618[local_61c]];
          if ((long)local_618[local_61c] < GA[local_1c0].num_blocks[local_61c] + -1) {
            *(C_Integer *)(&stack0xfffffffffffffac8 + (long)local_61c * 8) =
                 GA[local_1c0].mapc[local_624 + local_618[local_61c] + 1] + -1;
          }
          else {
            *(C_Integer *)(&stack0xfffffffffffffac8 + (long)local_61c * 8) =
                 GA[local_1c0].dims[local_61c];
          }
          local_624 = local_624 + (int)GA[local_1c0].num_blocks[local_61c];
        }
      }
    }
    lVar5 = (long)GA[local_1c0].p_handle;
    local_548 = local_1d8;
    for (local_638 = 0; (long)local_638 < (long)GA[local_1c0].ndim; local_638 = local_638 + 1) {
      if ((GA[local_1c0].last[local_638] < aCStack_4f8[local_638]) ||
         (*(long *)(&stack0xfffffffffffffac8 + local_638 * 8) < GA[local_1c0].last[local_638])) {
        sprintf(local_738,"check subscript failed:%ld not in (%ld:%ld) dim=%d",
                GA[local_1c0].last[local_638],aCStack_4f8[local_638],
                *(undefined8 *)(&stack0xfffffffffffffac8 + local_638 * 8),local_638 & 0xffffffff);
        pnga_error(in_stack_fffffffffffffa50,(Integer)in_stack_fffffffffffffa48);
      }
    }
    for (local_4a8 = 0; local_4a8 < local_4c0; local_4a8 = local_4a8 + 1) {
      local_4b0 = GA[local_1c0].width[local_4a8];
      local_4a0 = ((GA[local_1c0].last[local_4a8] - aCStack_4f8[local_4a8]) + local_4b0) * local_4b8
                  + local_4a0;
      local_4b8 = ((*(long *)(&stack0xfffffffffffffac8 + local_4a8 * 8) - aCStack_4f8[local_4a8]) +
                   1 + local_4b0 * 2) * local_4b8;
    }
    if (lVar5 == 0) {
      local_548 = (long)PGRP_LIST->inv_map_proc_list[local_1d8];
    }
    if (0 < GA[local_1c0].num_rstrctd) {
      local_548 = GA[local_1c0].rstrctd_list[local_548];
    }
    GA[local_1c0].shm_length =
         (C_Long)(GA[local_1c0].ptr[local_548] +
                 local_1d0 +
                 ((((GA[local_1c0].last[local_4c0] - aCStack_4f8[local_4c0]) +
                   GA[local_1c0].width[local_4c0]) * local_4b8 + local_4a0) *
                  (long)GA[local_1c0].elemsize - (long)local_1e8));
    GA_Default_Proc_Group = local_1dc;
  }
  return;
}

Assistant:

void ngai_get_first_last_indices( Integer g_a)  /* array handle (input) */
{

  Integer  lo[MAXDIM], hi[MAXDIM];
  Integer  nelems, nnodes, inode, nproc;
  Integer  ifirst, ilast, nfirst, nlast, icnt, np;
  Integer  i, j, itmp, ndim, map_offset[MAXDIM];
  /* Integer  icheck; */
  Integer  index[MAXDIM], subscript[MAXDIM];
  Integer  handle = GA_OFFSET + g_a;
  Integer  type, size=0, id;
  /* Integer  grp_id; */
  int Save_default_group;
  char     *fptr, *lptr;

  /* find total number of elements */
  ndim = GA[handle].ndim;
  nelems = 1;
  for (i=0; i<ndim; i++) nelems *= GA[handle].dims[i];

  /* If array is mirrored, evaluate first and last indices */
  if (pnga_is_mirrored(g_a)) {
    /* If default group is not world group, change default group to world group
       temporarily */
    Save_default_group = GA_Default_Proc_Group;
    GA_Default_Proc_Group = -1;
    nnodes = pnga_cluster_nnodes();
    inode = pnga_cluster_nodeid();
    nproc = pnga_cluster_nprocs(inode);
    /* grp_id = GA[handle].p_handle; */
    ifirst = (Integer)((double)(inode*nelems)/((double)nnodes));
    if (inode != nnodes-1) {
      ilast = (Integer)((double)((inode+1)*nelems)/((double)nnodes))-1;
    } else {
      ilast = nelems-1;
    }
    /* ifirst and ilast correspond to offsets in shared memory. Find the
       actual indices of the data elements corresponding to these offsets.
       The map_offset array provides a convenient mechanism for extracting
       the first indices on each processor along each coordinate dimension
       from the mapc array. */
    for (i = 0; i<ndim; i++) {
      map_offset[i] = 0;
      for (j = 0; j<i; j++) {
        map_offset[i] += GA[handle].nblock[j];
      }
    }
    icnt = 0;
    nfirst = -1;
    nlast = -1;
    for (i = 0; i<nproc; i++) {
      /* find block indices corresponding to proc i */
      pnga_proc_topology(g_a, i, index);
      nelems = 1;
      for (j = 0; j<ndim; j++) {
        if (index[j] < GA[handle].nblock[j]-1) {
          
          itmp = ((Integer)GA[handle].mapc[map_offset[j]+index[j]+1]
               - (Integer)GA[handle].mapc[map_offset[j]+index[j]]);
          nelems *= itmp;
        } else {
          itmp = ((Integer)GA[handle].dims[j]
               - (Integer)GA[handle].mapc[map_offset[j]+index[j]] + 1);
          nelems *= itmp;
        }
      }
      icnt += nelems;
      if (icnt-1 >= ifirst && nfirst < 0) {
        nfirst = i;
      }
      if (ilast <= icnt-1 && nfirst >= 0 && nlast < 0) {
        nlast = i;
      }
    }
    /* Adjust indices corresponding to start and end of block of
       shared memory so that it can be decomposed into large
       rectangular blocks of the global array. Start by
       adusting the lower index */
    icnt = 0;
    for (i = 0; i<nfirst; i++) {
      pnga_distribution(g_a, i, lo, hi);
      nelems = 1;
      for (j = 0; j<ndim; j++) {
        if (hi[j] >= lo[j]) {
          nelems *= (hi[j] - lo[j] + 1);
        } else {
          nelems = 0;
        }
      }
      icnt += nelems;
    }
    /* calculate offset in local block of memory */
    ifirst = ifirst - icnt;
    /* find dimensions of data on block nfirst */
    np = nfirst;
    pnga_distribution(g_a, np, lo, hi);
    nelems = 1;
    for (i=0; i<ndim-1; i++) {
      nelems *= (hi[i] - lo[i] + 1);
    }
    if (ifirst%nelems == 0) {
      ifirst = ifirst/nelems;
    } else {
      ifirst = (ifirst-ifirst%nelems)/nelems;
      ifirst++;
    }
    if (ifirst > GA[handle].dims[ndim-1]-1) ifirst=GA[handle].dims[ndim-1]-1;
    /* adjust value of ifirst */
    pnga_proc_topology(g_a, nfirst, index);
    subscript[ndim-1] = ifirst;
    for (i=0; i<ndim-1; i++) {
      subscript[i] = 0;
    }
    /* Finally, evaluate absolute indices of first data point */
    for (i=0; i<ndim; i++) {
      GA[handle].first[i] = GA[handle].mapc[map_offset[i]+index[i]]
                          + (C_Integer)subscript[i];
    }
    /* adjust upper bound. If nlast = nfirst, just use old value of icnt */
    if (nlast > nfirst) {
      icnt = 0;
      for (i = 0; i<nlast; i++) {
        pnga_distribution(g_a, i, lo, hi);
        nelems = 1;
        for (j = 0; j<ndim; j++) {
          if (hi[j] >= lo[j]) {
            nelems *= (hi[j] - lo[j] + 1);
          } else {
            nelems = 0;
          }
        }
        icnt += nelems;
      }
    }
    ilast = ilast - icnt;
    /* find dimensions of data on block nlast */
    np = nlast;
    pnga_distribution(g_a, np, lo, hi);
    nelems = 1;
    for (i=0; i<ndim-1; i++) {
      nelems *= (hi[i] - lo[i] + 1);
    }
    ilast = (ilast-ilast%nelems)/nelems;
    /* adjust value of ilast */
    subscript[ndim-1] = ilast;
    for (i=0; i<ndim-1; i++) {
      subscript[i] = (hi[i] - lo[i]);
    }
    pnga_proc_topology(g_a, nlast, index);
    /*
    icheck = 1;
    for (i=1; i<ndim; i++) {
      if (index[i] < GA[handle].nblock[i]-1) {
        itmp = (Integer)GA[handle].mapc[map_offset[i]+index[i]+1]
             - (Integer)GA[handle].mapc[map_offset[i]+index[i]];
      } else {
        itmp = (Integer)GA[handle].dims[i]
             - (Integer)GA[handle].mapc[map_offset[i]+index[i]] + 1;
      }
      if (subscript[i] < itmp-1) icheck = 0;
      subscript[i] = itmp-1;
    }
    if (!icheck) {
      subscript[0]--;
    } */
    /* Finally, evaluate absolute indices of last data point */
    for (i=0; i<ndim; i++) {
      GA[handle].last[i] = GA[handle].mapc[map_offset[i]+index[i]]
                          + (C_Integer)subscript[i];
      if (GA[handle].last[i] > GA[handle].dims[i]) {
        GA[handle].last[i] = GA[handle].dims[i];
      }
    }
    /* find length of shared memory segment owned by this node. Adjust
     * length, if necessary, to account for gaps in memory between
     * processors */
    type = GA[handle].type;
    switch(type) {
      case C_FLOAT: size = sizeof(float); break;
      case C_DBL: size = sizeof(double); break;
      case C_LONG: size = sizeof(long); break;
      case C_LONGLONG: size = sizeof(long long); break;
      case C_INT: size = sizeof(int); break;
      case C_SCPL: size = 2*sizeof(float); break;
      case C_DCPL: size = 2*sizeof(double); break;
      default: pnga_error("type not supported",type);
    }
    for (i=0; i<ndim; i++) index[i] = (Integer)GA[handle].first[i];
    i = (int)pnga_locate(g_a, index, &id);
    gam_Loc_ptr(id, handle, (Integer)GA[handle].first, &fptr);

    for (i=0; i<ndim; i++) index[i] = (Integer)GA[handle].last[i];
    i = (int)pnga_locate(g_a, index, &id);
    gam_Loc_ptr(id, handle, (Integer)GA[handle].last, &lptr);

    GA[handle].shm_length = (C_Long)(lptr - fptr + size);
    GA_Default_Proc_Group = Save_default_group;
  } else {
    for (i=0; i<ndim; i++) {
      GA[handle].first[i] = 0;
      GA[handle].last[i] = -1;
      GA[handle].shm_length = -1;
    }
  }
}